

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.h
# Opt level: O2

void __thiscall BasePort::BroadcastReadInfo::BroadcastReadInfo(BroadcastReadInfo *this)

{
  long lVar1;
  
  this->gapTime = 0.0;
  this->readSizeQuads = 0;
  this->readSequence = 0;
  this->updateStartTime = 0.0;
  *(undefined8 *)((long)&this->updateStartTime + 1) = 0;
  *(undefined8 *)((long)&this->updateFinishTime + 1) = 0;
  this->readStartTime = 0.0;
  this->readFinishTime = 0.0;
  this->readOverflow = false;
  lVar1 = 0;
  do {
    *(undefined2 *)(&this->boardInfo[0].inUse + lVar1) = 0;
    *(undefined8 *)((long)&this->boardInfo[0].updateTime + lVar1) = 0;
    *(undefined8 *)((long)&this->boardInfo[0].blockNum + lVar1) = 0;
    *(undefined8 *)((long)&this->boardInfo[0].blockSize + lVar1 + 1) = 0;
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0x200);
  this->gapTimeMin = 1.0;
  this->gapTimeMax = 0.0;
  return;
}

Assistant:

BroadcastReadInfo() : readSizeQuads(0), readSequence(0), updateStartTime(0.0), updateFinishTime(0.0),
                              updateOverflow(false), readStartTime(0.0), readFinishTime(0.0), readOverflow(false),
                              gapTime(0.0) { Clear(); }